

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

ssize_t __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
          (intrusive_list<(anonymous_namespace)::TestObject> *this,int __fdin,__off64_t *__offin,
          int __fdout,__off64_t *__offout,size_t __len,uint __flags)

{
  iterator pos;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  iterator iVar3;
  iterator pos_00;
  undefined4 in_stack_0000000c;
  TestObject *in_stack_00000010;
  TestObject *local_70;
  intrusive_list<(anonymous_namespace)::TestObject> local_60;
  undefined8 local_48;
  intrusive_list<(anonymous_namespace)::TestObject> *local_38;
  intrusive_list<(anonymous_namespace)::TestObject> *other_local;
  intrusive_list<(anonymous_namespace)::TestObject> *this_local;
  iterator first_local;
  iterator pos_local;
  
  first_local.node_ = (TestObject *)CONCAT44(in_register_00000034,__fdin);
  local_38 = (intrusive_list<(anonymous_namespace)::TestObject> *)
             CONCAT44(in_register_0000000c,__fdout);
  other_local = this;
  this_local = (intrusive_list<(anonymous_namespace)::TestObject> *)__offout;
  first_local.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)__len;
  while( true ) {
    local_48 = CONCAT44(in_stack_0000000c,__flags);
    iVar3.list_._4_4_ = in_stack_0000000c;
    iVar3.list_._0_4_ = __flags;
    iVar3.node_ = in_stack_00000010;
    bVar2 = iterator::operator!=((iterator *)&this_local,iVar3);
    piVar1 = local_38;
    if (!bVar2) break;
    local_60.last_ = first_local.node_;
    local_60.size_ = (size_t)__offin;
    iVar3 = iterator::operator++((iterator *)&this_local,0);
    local_70 = (TestObject *)iVar3.list_;
    pos_00.node_ = local_70;
    pos_00.list_ = piVar1;
    extract(&local_60,pos_00);
    pos.node_ = (TestObject *)local_60.size_;
    pos.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)local_60.last_;
    insert(this,pos,(unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                     *)&local_60);
    std::
    unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                   *)&local_60);
  }
  return CONCAT71(extraout_var,bVar2);
}

Assistant:

inline void intrusive_list<T>::splice(iterator pos,
                                      intrusive_list& other,
                                      iterator first,
                                      iterator last) {
  while (first != last)
    insert(pos, other.extract(first++));
}